

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O2

void __thiscall
HSimplexNla::reportVector
          (HSimplexNla *this,string *message,HighsInt num_index,
          vector<double,_std::allocator<double>_> *vector_value,
          vector<int,_std::allocator<int>_> *vector_index,bool force)

{
  HighsInt vecDim;
  ulong uVar1;
  allocator local_71;
  string local_70;
  string local_50;
  
  if (this->report_ == false) {
    if (num_index < 1 || !force) {
      return;
    }
  }
  else if (num_index < 1) {
    return;
  }
  if (0x19 < (uint)num_index) {
    vecDim = this->lp_->num_row_;
    std::__cxx11::string::string((string *)&local_50,(string *)message);
    std::__cxx11::string::string((string *)&local_70,"Unknown",&local_71);
    analyseVectorValues((HighsLogOptions *)0x0,&local_50,vecDim,vector_value,true,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  uVar1 = 0;
  printf("%s",(message->_M_dataplus)._M_p);
  while( true ) {
    if ((uint)num_index == uVar1) break;
    if ((int)((uVar1 & 0xffffffff) / 5) * -5 + (int)uVar1 == 0) {
      putchar(10);
    }
    printf("[%4d %11.4g] ",
           (vector_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar1],
           (ulong)(uint)(vector_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar1]);
    uVar1 = uVar1 + 1;
  }
  putchar(10);
  return;
}

Assistant:

void HSimplexNla::reportVector(const std::string message,
                               const HighsInt num_index,
                               const vector<double> vector_value,
                               const vector<HighsInt> vector_index,
                               const bool force) const {
  if (!report_ && !force) return;
  assert((int)vector_value.size() >= num_index);
  if (num_index <= 0) return;
  const HighsInt num_row = lp_->num_row_;
  if (num_index > kReportItemLimit) {
    analyseVectorValues(nullptr, message, num_row, vector_value, true);
  } else {
    printf("%s", message.c_str());
    for (HighsInt iX = 0; iX < num_index; iX++) {
      if (iX % 5 == 0) printf("\n");
      printf("[%4d %11.4g] ", (int)vector_index[iX], vector_value[iX]);
    }
    printf("\n");
  }
}